

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  Am_Object *pAVar1;
  Am_Wrapper *pAVar2;
  Am_Constraint *pAVar3;
  Am_Object *pAVar4;
  Am_Object_Advanced obj_adv;
  Am_Object h_scroll;
  Am_Object v_scroll;
  Am_Formula local_a0;
  Am_Object local_90;
  Am_Formula local_88;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Formula local_50;
  Am_Formula local_40;
  Am_Formula local_30;
  Am_Object local_20;
  Am_Object local_18;
  
  Am_Object_Advanced::Am_Object_Advanced((Am_Object_Advanced *)&local_90);
  local_68.data = (Am_Object_Data *)0x0;
  local_70.data = (Am_Object_Data *)0x0;
  Am_Object::Create(&local_78,(char *)&Am_Widget_Group);
  pAVar1 = Am_Object::Add(&local_78,0x11d,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x11e,0,0);
  pAVar1 = Am_Object::Set(pAVar1,0x66,0x96,0);
  pAVar1 = Am_Object::Set(pAVar1,0x67,0x96,0);
  pAVar1 = Am_Object::Add(pAVar1,0xcc,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x17d,true,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar1 = Am_Object::Add(pAVar1,0x6a,pAVar2,0);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
  pAVar1 = Am_Object::Add(pAVar1,0x6b,pAVar2,0);
  pAVar1 = Am_Object::Add(pAVar1,400,0,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18a,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18b,true,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18c,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18d,false,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bb,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1bc,pAVar3,0);
  pAVar1 = Am_Object::Add(pAVar1,0x1bd,10,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_jump_page);
  pAVar1 = Am_Object::Add(pAVar1,0x1be,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,2000,scrolling_group_draw.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7d7,scrolling_group_invalid.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7dc,scroll_group_translate_coordinates.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7da,scroll_group_point_in_part.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7db,scroll_group_point_in_leaf.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x7d9,scroll_group_point_in_obj.from_wrapper,0);
  pAVar1 = Am_Object::Add(pAVar1,0x18e,400,0);
  pAVar1 = Am_Object::Add(pAVar1,399,400,0);
  pAVar1 = Am_Object::Add(pAVar1,0xc5,-1,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&Am_Set_Old_Owner_To_Me);
  pAVar1 = Am_Object::Add(pAVar1,0x12d,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_left);
  pAVar1 = Am_Object::Add(pAVar1,0x1bf,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_top);
  pAVar1 = Am_Object::Add(pAVar1,0x1c0,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_width);
  pAVar1 = Am_Object::Add(pAVar1,0x1c1,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&scroll_clip_height);
  pAVar1 = Am_Object::Add(pAVar1,0x1c2,pAVar3,0);
  Am_Object::Create(&local_20,(char *)&Am_Vertical_Scroll_Bar);
  pAVar4 = Am_Object::Set(&local_20,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_v_scroller_value_from_y_offset);
  pAVar4 = Am_Object::Add(pAVar4,0x8c,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_left);
  pAVar4 = Am_Object::Set(pAVar4,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_top);
  pAVar4 = Am_Object::Set(pAVar4,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_height);
  pAVar4 = Am_Object::Set(pAVar4,0x67,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_visible);
  pAVar4 = Am_Object::Set(pAVar4,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_active);
  pAVar4 = Am_Object::Set(pAVar4,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_a0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_a0);
  pAVar4 = Am_Object::Set(pAVar4,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_88);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_88);
  pAVar4 = Am_Object::Set(pAVar4,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_30);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_30);
  pAVar4 = Am_Object::Set(pAVar4,0x6a,pAVar3,0);
  pAVar4 = Am_Object::Set(pAVar4,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_value_2);
  pAVar4 = Am_Object::Set(pAVar4,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_40);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_40);
  pAVar4 = Am_Object::Set(pAVar4,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_50);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_50);
  pAVar4 = Am_Object::Set(pAVar4,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&v_scroll_percent_visible);
  pAVar4 = Am_Object::Set(pAVar4,0x185,pAVar3,0);
  pAVar4 = Am_Object::operator=(&local_68,pAVar4);
  Am_Object::Am_Object(&local_18,pAVar4);
  pAVar1 = Am_Object::Add_Part(pAVar1,0x1c4,&local_18,0);
  Am_Object::operator=(&Am_Scrolling_Group,pAVar1);
  Am_Object::~Am_Object(&local_18);
  Am_Formula::~Am_Formula(&local_50);
  Am_Formula::~Am_Formula(&local_40);
  Am_Formula::~Am_Formula(&local_30);
  Am_Formula::~Am_Formula(&local_88);
  Am_Formula::~Am_Formula(&local_a0);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_78);
  Am_Object::Create(&local_78,(char *)&Am_Horizontal_Scroll_Bar);
  pAVar1 = Am_Object::Set(&local_78,0x169,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&set_h_scroller_value_from_x_offset);
  pAVar1 = Am_Object::Add(pAVar1,0x8b,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_left);
  pAVar1 = Am_Object::Set(pAVar1,100,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_top);
  pAVar1 = Am_Object::Set(pAVar1,0x65,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_width);
  pAVar1 = Am_Object::Set(pAVar1,0x66,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x69,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_active);
  pAVar1 = Am_Object::Set(pAVar1,0xcc,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_a0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_a0);
  pAVar1 = Am_Object::Set(pAVar1,0x17d,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_88);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_88);
  pAVar1 = Am_Object::Set(pAVar1,0x17f,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_30);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_30);
  pAVar1 = Am_Object::Set(pAVar1,0x6a,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,0x181,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_value_2);
  pAVar1 = Am_Object::Set(pAVar1,0x182,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_40);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_40);
  pAVar1 = Am_Object::Set(pAVar1,0x183,pAVar3,0);
  Am_From_Owner((Am_Slot_Key)&local_50);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&local_50);
  pAVar1 = Am_Object::Set(pAVar1,0x184,pAVar3,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&h_scroll_percent_visible);
  pAVar1 = Am_Object::Set(pAVar1,0x185,pAVar3,0);
  pAVar1 = Am_Object::operator=(&local_70,pAVar1);
  Am_Object::Am_Object(&local_58,pAVar1);
  Am_Object::Add_Part(&Am_Scrolling_Group,0x1c3,&local_58,0);
  Am_Object::~Am_Object(&local_58);
  Am_Formula::~Am_Formula(&local_50);
  Am_Formula::~Am_Formula(&local_40);
  Am_Formula::~Am_Formula(&local_30);
  Am_Formula::~Am_Formula(&local_88);
  Am_Formula::~Am_Formula(&local_a0);
  Am_Object::~Am_Object(&local_78);
  Am_Object::operator=(&local_90,&Am_Scrolling_Group);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x6b);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x11d);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x11e);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18a);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18b);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18c);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,0x18d);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  local_a0.super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_90,400);
  Am_Slot::Set_Demon_Bits((Am_Slot *)&local_a0,5);
  Am_Object::Am_Object(&local_60,&Am_Scrolling_Group);
  remove_scrollers(&local_60);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_68,0xc5);
  pAVar1 = Am_Object::Set((Am_Object *)&local_a0,0x150,"Scroll Vertical",0);
  pAVar1 = Am_Object::Set(pAVar1,0xca,scroll_group_v_do.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x146,scroll_group_v_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x147,scroll_group_v_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x148,scroll_group_v_selective_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x149,scroll_group_v_selective_repeat.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::Get_Object((Am_Object *)&local_88,(Am_Slot_Key)&local_68,0x1ac);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_88,0xc5);
  Am_Object::Set((Am_Object *)&local_a0,0xc9,scroll_group_v_inter_abort_do.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_70,0xc5);
  pAVar1 = Am_Object::Set((Am_Object *)&local_a0,0x150,"Scroll Horizontal",0);
  pAVar1 = Am_Object::Set(pAVar1,0xca,scroll_group_h_do.from_wrapper,0);
  pAVar3 = Am_Formula::operator_cast_to_Am_Constraint_(&get_impl_parent_from_group);
  pAVar1 = Am_Object::Set(pAVar1,0x154,pAVar3,0);
  pAVar1 = Am_Object::Set(pAVar1,0x146,scroll_group_h_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x147,scroll_group_h_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x148,scroll_group_h_selective_undo.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x149,scroll_group_h_selective_repeat.from_wrapper,0);
  pAVar1 = Am_Object::Set(pAVar1,0x14a,0,0);
  Am_Object::Set(pAVar1,0x167,-2,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::Get_Object((Am_Object *)&local_88,(Am_Slot_Key)&local_70,0x1ac);
  Am_Object::Get_Object((Am_Object *)&local_a0,(Am_Slot_Key)&local_88,0xc5);
  Am_Object::Set((Am_Object *)&local_a0,0xc9,scroll_group_h_inter_abort_do.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&local_a0);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_90);
  return extraout_EAX;
}

Assistant:

static void
init()
{

  Am_Choice_Internal_Command =
      Am_Command.Create(DSTR("Am_Choice_Command"))
          .Set(Am_LABEL, "Choice")
          .Set(Am_UNDO_METHOD, Am_Choice_Command_Undo)
          .Set(Am_REDO_METHOD, Am_Choice_Command_Undo) //undo works for both
          .Set(Am_SELECTIVE_UNDO_METHOD, Am_Choice_Command_Selective_Undo)
          .Set(Am_SELECTIVE_REPEAT_SAME_METHOD, Am_Choice_Command_Repeat_Same)
          .Set(Am_SELECTIVE_REPEAT_ON_NEW_METHOD, Am_Choice_Command_Repeat_New);

  Am_Choice_Interactor =
      Am_Interactor.Create(DSTR("Am_Choice_Interactor"))
          .Set(Am_INTER_START_METHOD, Am_Choice_Start_Method)
          .Set(Am_INTER_ABORT_METHOD, Am_Choice_Abort_Method)
          .Set(Am_INTER_OUTSIDE_METHOD, Am_Choice_Outside_Method)
          .Set(Am_INTER_BACK_INSIDE_METHOD, Am_Choice_Back_Inside_Method)
          .Set(Am_INTER_RUNNING_METHOD, Am_Choice_Running_Method)
          .Set(Am_INTER_STOP_METHOD, Am_Choice_Stop_Method)

          .Set(Am_START_DO_METHOD, Am_Choice_Start_Do)
          .Set(Am_INTERIM_DO_METHOD, Am_Choice_Interim_Do)
          .Set(Am_ABORT_DO_METHOD, Am_Choice_Abort_Do)
          .Set(Am_DO_METHOD, Am_Choice_Do)

          .Add(Am_FIRST_ONE_ONLY, false) // whether menu or button like
          .Set(Am_RUNNING_WHERE_TEST, same_as_start_where_test)
          .Add(Am_HOW_SET, Am_CHOICE_TOGGLE)
          .Add(Am_SET_SELECTED, true)
          .Add_Part(Am_IMPLEMENTATION_COMMAND,
                    Am_Choice_Internal_Command.Create(
                        DSTR("Choice_Internal_Command")));
  Am_Choice_Interactor.Set_Part(
      Am_COMMAND, Am_Select_Command.Create(DSTR("Am_Command_in_Choice"))
                      .Set(Am_LABEL, "Choice"));

  Am_One_Shot_Interactor =
      Am_Choice_Interactor.Create(DSTR("Am_One_Shot_Interactor"))
          .Set(Am_START_WHERE_TEST, Am_Inter_In)
          .Set(Am_CONTINUOUS, false);
  //change all the names
  Am_One_Shot_Interactor.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "One_Shot")
      .Set_Name(DSTR("Am_Command_in_One_Shot"));

  Am_One_Shot_Interactor.Get_Object(Am_IMPLEMENTATION_COMMAND)
      .Set(Am_LABEL, "One_Shot")
      .Set_Name(DSTR("One_Shot_Internal_Command"));
  Am_Choice_Interactor_Repeat_Same =
      Am_Choice_Interactor.Create(DSTR("Choice_Interactor_Repeat_Same"));
  Am_Choice_Interactor_Repeat_Same.Get_Object(Am_IMPLEMENTATION_COMMAND)
      .Set(Am_SELECTIVE_REPEAT_ON_NEW_METHOD,
           Am_Choice_Command_Repeat_New_As_Same);
}